

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

int __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::access
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,char *__name,
          int __type)

{
  ushort uVar1;
  int iVar2;
  char *__name_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar3;
  undefined4 in_register_00000014;
  char *pcVar4;
  char *extraout_RDX;
  ulong uVar5;
  bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this_00;
  
  pcVar4 = (char *)CONCAT44(in_register_00000014,__type);
  uVar5 = (ulong)__name & 0xffffffff;
  __name_00 = pcVar4;
  while( true ) {
    iVar2 = bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::access
                      ((this->wavelet_tree).
                       super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar5,__name_00,(int)pcVar4);
    pvVar3 = &this->child0;
    if (SUB41(iVar2,0) != false) {
      pvVar3 = &this->child1;
    }
    uVar1 = (pvVar3->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    if (this->sigma <= uVar1) break;
    this_00 = (this->wavelet_tree).
              super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar5;
    uVar5 = (ulong)uVar1;
    __name_00 = (char *)bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
                                  (this_00,(size_t)__name_00,SUB41(iVar2,0));
    pcVar4 = extraout_RDX;
  }
  return (uint)CONCAT11((char)(uVar1 >> 8),(char)uVar1 - this->sigma);
}

Assistant:

inline symbol access(uint node, ulint i){

			bool bit = wavelet_tree[node].access(i);

			uint next_node = (bit==0?child0[node]:child1[node]);

			if(next_node>=sigma)//next node is leaf:return symbol
				return next_node-sigma;

			//else: next_node is a valid address in wavelet_tree

			ulint next_i = wavelet_tree[node].rank(i,bit);

			return access(next_node, next_i);

		}